

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall
caffe::EltwiseParameter::InternalSwap(EltwiseParameter *this,EltwiseParameter *other)

{
  InternalMetadataWithArena *this_00;
  EltwiseParameter *other_local;
  EltwiseParameter *this_local;
  Container *local_30;
  
  google::protobuf::RepeatedField<float>::InternalSwap(&this->coeff_,&other->coeff_);
  std::swap<int>(&this->operation_,&other->operation_);
  std::swap<bool>(&this->stable_prod_grad_,&other->stable_prod_grad_);
  std::swap<unsigned_int>((this->_has_bits_).has_bits_,(other->_has_bits_).has_bits_);
  this_00 = &other->_internal_metadata_;
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) != 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) != 1) goto LAB_0078e1f5;
  }
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
               ::
               PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                         ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                           *)this_00);
  }
  else {
    local_30 = (Container *)
               google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&this_00->
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap
            (&this->_internal_metadata_,&local_30->unknown_fields);
LAB_0078e1f5:
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void EltwiseParameter::InternalSwap(EltwiseParameter* other) {
  coeff_.InternalSwap(&other->coeff_);
  std::swap(operation_, other->operation_);
  std::swap(stable_prod_grad_, other->stable_prod_grad_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}